

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeThreadData.cpp
# Opt level: O3

void __thiscall RuntimeThreadData::~RuntimeThreadData(RuntimeThreadData *this)

{
  _List_node_base *p_Var1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  
  CloseHandle(this->hevntInitialScriptCompleted);
  CloseHandle(this->hevntReceivedBroadcast);
  CloseHandle(this->hevntShutdown);
  CloseHandle(this->hThread);
  DeleteCriticalSection(&this->csReportQ);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->reportQ).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  p_Var3 = (this->children).
           super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->children) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var1;
  }
  pcVar2 = (this->initialSource)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == &(this->initialSource).field_2) {
    return;
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

RuntimeThreadData::~RuntimeThreadData()
{
    CloseHandle(this->hevntInitialScriptCompleted);
    CloseHandle(this->hevntReceivedBroadcast);
    CloseHandle(this->hevntShutdown);
    CloseHandle(this->hThread);
    DeleteCriticalSection(&csReportQ);
}